

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O1

ValueType_t RegistryValue::typestr_to_valuetype(string *typestr)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string *__return_storage_ptr__;
  ValueType_t VVar4;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> bStack_38;
  
  iVar2 = std::__cxx11::string::compare((char *)typestr);
  if (iVar2 == 0) {
    VVar4 = 0;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)typestr);
    VVar4 = 1;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)typestr);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)typestr);
        VVar4 = 2;
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)typestr);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)typestr);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)typestr);
              VVar4 = 3;
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)typestr);
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)typestr);
                  VVar4 = 4;
                  if (iVar2 != 0) {
                    iVar2 = std::__cxx11::string::compare((char *)typestr);
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)typestr);
                      VVar4 = 0xb;
                      if (iVar2 != 0) {
                        iVar2 = std::__cxx11::string::compare((char *)typestr);
                        if (iVar2 != 0) {
                          iVar2 = std::__cxx11::string::compare((char *)typestr);
                          if (iVar2 != 0) {
                            iVar2 = std::__cxx11::string::compare((char *)typestr);
                            if (iVar2 == 0) {
                              VVar4 = 5;
                            }
                            else {
                              iVar2 = std::__cxx11::string::compare((char *)typestr);
                              VVar4 = 7;
                              if (iVar2 != 0) {
                                iVar2 = std::__cxx11::string::compare((char *)typestr);
                                if (iVar2 != 0) {
                                  iVar2 = std::__cxx11::string::compare((char *)typestr);
                                  if (iVar2 == 0) {
                                    VVar4 = 0x15;
                                  }
                                  else {
                                    iVar2 = std::__cxx11::string::compare((char *)typestr);
                                    if (iVar2 == 0) {
                                      VVar4 = 6;
                                    }
                                    else {
                                      iVar2 = std::__cxx11::string::compare((char *)typestr);
                                      VVar4 = 8;
                                      if (iVar2 != 0) {
                                        iVar2 = std::__cxx11::string::compare((char *)typestr);
                                        if (iVar2 != 0) {
                                          iVar2 = std::__cxx11::string::compare((char *)typestr);
                                          if (iVar2 != 0) {
                                            iVar2 = std::__cxx11::string::compare((char *)typestr);
                                            VVar4 = 9;
                                            if (iVar2 != 0) {
                                              iVar2 = std::__cxx11::string::compare((char *)typestr)
                                              ;
                                              if (iVar2 != 0) {
                                                iVar2 = std::__cxx11::string::compare
                                                                  ((char *)typestr);
                                                VVar4 = 10;
                                                if (iVar2 != 0) {
                                                  iVar2 = std::__cxx11::string::compare
                                                                    ((char *)typestr);
                                                  if (iVar2 != 0) {
                                                    std::__cxx11::
                                                                                                        
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  ::basic_regex(&bStack_38,"^\\s*[0-9]+\\s*$",0x10);
                                                  bVar1 = std::
                                                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                            (typestr,&bStack_38,0);
                                                  std::__cxx11::
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  ::~basic_regex(&bStack_38);
                                                  if (!bVar1) {
                                                    __return_storage_ptr__ =
                                                         (string *)__cxa_allocate_exception(0x20);
                                                    stringformat_abi_cxx11_
                                                              (__return_storage_ptr__,
                                                               "unknown value type: %hs",
                                                               (typestr->_M_dataplus)._M_p);
                                                    __cxa_throw(__return_storage_ptr__,
                                                                &std::__cxx11::string::typeinfo,
                                                                std::__cxx11::string::~string);
                                                  }
                                                  uVar3 = strtoul((typestr->_M_dataplus)._M_p,
                                                                  (char **)0x0,0);
                                                  VVar4 = (ValueType_t)uVar3;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar4;
}

Assistant:

static ValueType_t typestr_to_valuetype(const std::string& typestr)
    {
        if (typestr=="none")                       return REG_NONE;
        if (typestr=="sz")                         return REG_SZ;
        if (typestr=="string")                     return REG_SZ;
        if (typestr=="expand_sz")                  return REG_EXPAND_SZ;
        if (typestr=="expandsz")                   return REG_EXPAND_SZ;
        if (typestr=="expand")                     return REG_EXPAND_SZ;
        if (typestr=="binary")                     return REG_BINARY;
        if (typestr=="hex")                        return REG_BINARY;
        if (typestr=="dword")                      return REG_DWORD;
        if (typestr=="dwordle")                    return REG_DWORD_LITTLE_ENDIAN;
        if (typestr=="qword")                      return REG_QWORD;
        if (typestr=="qwordle")                    return REG_QWORD_LITTLE_ENDIAN;
        if (typestr=="qword")                      return REG_QWORD;
        if (typestr=="dwordbe")                    return REG_DWORD_BIG_ENDIAN;
        if (typestr=="multisz")                    return REG_MULTI_SZ;
        if (typestr=="multi_sz")                   return REG_MULTI_SZ;
        if (typestr=="mui_sz")                     return REG_MUI_SZ;
        if (typestr=="link")                       return REG_LINK;
        if (typestr=="resourcelist")               return REG_RESOURCE_LIST;
        if (typestr=="resource_list")              return REG_RESOURCE_LIST;
        if (typestr=="rl")                         return REG_RESOURCE_LIST;
        if (typestr=="full_resource_descriptor")   return REG_FULL_RESOURCE_DESCRIPTOR;
        if (typestr=="frd")                        return REG_FULL_RESOURCE_DESCRIPTOR;
        if (typestr=="resource_requirements_list") return REG_RESOURCE_REQUIREMENTS_LIST;
        if (typestr=="rrl")                        return REG_RESOURCE_REQUIREMENTS_LIST;

        if (REGEX_MATCH(typestr, CHARREGEX("^\\s*[0-9]+\\s*$")))
            return strtoul(typestr.c_str(), 0, 0);

        throw stringformat("unknown value type: %hs", typestr.c_str());

    }